

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdns.c
# Opt level: O0

sockaddr_in *
mdns_record_parse_a(void *buffer,size_t size,size_t offset,size_t length,sockaddr_in *addr)

{
  sockaddr_in *addr_local;
  size_t length_local;
  size_t offset_local;
  size_t size_local;
  void *buffer_local;
  
  memset(addr,0,0x10);
  addr->sin_family = 2;
  if ((offset + length <= size) && (length == 4)) {
    (addr->sin_addr).s_addr = *(in_addr_t *)((long)buffer + offset);
  }
  return addr;
}

Assistant:

struct sockaddr_in*
mdns_record_parse_a(const void* buffer, size_t size, size_t offset, size_t length,
                    struct sockaddr_in* addr) {
	memset(addr, 0, sizeof(struct sockaddr_in));
	addr->sin_family = AF_INET;
#ifdef __APPLE__
	addr->sin_len = sizeof(struct sockaddr_in);
#endif
	if ((size >= offset + length) && (length == 4))
		addr->sin_addr.s_addr = *(const uint32_t*)((const char*)buffer + offset);
	return addr;
}